

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult * __thiscall
testing::AssertionResult::operator<<
          (AssertionResult *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  Message *a_message;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  AssertionResult *this_local;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  Message::Message((Message *)&this_local);
  a_message = Message::operator<<((Message *)&this_local,value);
  AppendMessage(this,a_message);
  Message::~Message((Message *)&this_local);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

AssertionResult& operator<<(const T& value) {
    AppendMessage(Message() << value);
    return *this;
  }